

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

int __thiscall
cpp_client::Connection::connect(Connection *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  ostream *poVar2;
  pointer this_00;
  undefined4 in_register_00000034;
  bool print_local;
  uint port_local;
  char *host_local;
  Connection *this_local;
  
  if ((__len & 1) != 0) {
    poVar2 = ::operator<<((ostream *)&std::cout,text_cyan);
    poVar2 = std::operator<<(poVar2,"Connecting to: ");
    poVar2 = std::operator<<(poVar2,(char *)CONCAT44(in_register_00000034,__fd));
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)__addr);
    poVar2 = std::operator<<(poVar2,'\n');
    ::operator<<(poVar2,normal);
  }
  this_00 = std::
            unique_ptr<cpp_client::Connection_internal,_std::default_delete<cpp_client::Connection_internal>_>
            ::operator->(&this->conn_);
  iVar1 = Connection_internal::connect(this_00,__fd,(sockaddr *)((ulong)__addr & 0xffffffff),__len);
  return iVar1;
}

Assistant:

void Connection::connect(const char* host, unsigned port, bool print)
{
   if(print)
   {
      std::cout << sgr::text_cyan << "Connecting to: " << host << ":" << port << '\n' << sgr::reset;
   }
   conn_->connect(host, port);
}